

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall
TxConfirmStats::removeTx
          (TxConfirmStats *this,uint entryHeight,uint nBestSeenHeight,uint bucketindex,bool inBlock)

{
  uint uVar1;
  pointer pvVar2;
  long lVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  LogFlags category;
  ulong uVar6;
  pointer piVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  pointer pvVar11;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  uint blockIndex;
  uint bucketindex_local;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = nBestSeenHeight - entryHeight;
  if (nBestSeenHeight == 0) {
    uVar9 = 0;
  }
  bucketindex_local = bucketindex;
  if ((int)uVar9 < 0) {
    bVar5 = ::LogAcceptCategory((LogFlags)this,entryHeight);
    if (bVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
        ;
        source_file_00._M_len = 0x5f;
        logging_function_00._M_str = "removeTx";
        logging_function_00._M_len = 8;
        LogPrintFormatInternal<>
                  (logging_function_00,source_file_00,0x1e8,ESTIMATEFEE,Debug,
                   (ConstevalFormatString<0U>)0xcb75ac);
        return;
      }
      goto LAB_007bbb24;
    }
  }
  else {
    pvVar2 = (this->unconfTxs).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    category = ((long)(this->unconfTxs).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18;
    if ((int)uVar9 < (int)category) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = category;
      blockIndex = SUB164(ZEXT416(entryHeight) % auVar4,0);
      piVar7 = pvVar2[SUB168(ZEXT416(entryHeight) % auVar4,0)].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      iVar8 = piVar7[bucketindex];
      if (iVar8 < 1) {
        bVar5 = ::LogAcceptCategory(category,entryHeight);
        if (bVar5) {
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
          ;
          source_file._M_len = 0x5f;
          logging_function._M_str = "removeTx";
          logging_function._M_len = 8;
          LogPrintFormatInternal<unsigned_int,unsigned_int>
                    (logging_function,source_file,0x1fa,ESTIMATEFEE,Debug,
                     (ConstevalFormatString<2U>)0xcb7634,&blockIndex,&bucketindex_local);
        }
      }
      else {
LAB_007bba5f:
        piVar7[bucketindex] = iVar8 + -1;
      }
    }
    else {
      piVar7 = (this->oldUnconfTxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar8 = piVar7[bucketindex];
      if (0 < iVar8) goto LAB_007bba5f;
      bVar5 = ::LogAcceptCategory(category,entryHeight);
      if (bVar5) {
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
        ;
        source_file_01._M_len = 0x5f;
        logging_function_01._M_str = "removeTx";
        logging_function_01._M_len = 8;
        LogPrintFormatInternal<unsigned_int>
                  (logging_function_01,source_file_01,0x1f1,ESTIMATEFEE,Debug,
                   (ConstevalFormatString<1U>)0xcb75e6,&bucketindex_local);
      }
    }
    if ((!inBlock) && (uVar1 = this->scale, uVar1 <= uVar9)) {
      if (uVar1 == 0) {
        __assert_fail("scale != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                      ,0x1fe,
                      "void TxConfirmStats::removeTx(unsigned int, unsigned int, unsigned int, bool)"
                     );
      }
      uVar10 = 0;
      pvVar11 = (this->failAvg).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->failAvg).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar11) / 0x18;
      if ((ulong)uVar9 / (ulong)uVar1 < uVar6) {
        uVar6 = (ulong)uVar9 / (ulong)uVar1;
      }
      for (; uVar10 < uVar6; uVar10 = uVar10 + 1) {
        lVar3 = *(long *)&(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data;
        *(double *)(lVar3 + (ulong)bucketindex_local * 8) =
             *(double *)(lVar3 + (ulong)bucketindex_local * 8) + 1.0;
        pvVar11 = pvVar11 + 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_007bbb24:
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::removeTx(unsigned int entryHeight, unsigned int nBestSeenHeight, unsigned int bucketindex, bool inBlock)
{
    //nBestSeenHeight is not updated yet for the new block
    int blocksAgo = nBestSeenHeight - entryHeight;
    if (nBestSeenHeight == 0)  // the BlockPolicyEstimator hasn't seen any blocks yet
        blocksAgo = 0;
    if (blocksAgo < 0) {
        LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, blocks ago is negative for mempool tx\n");
        return;  //This can't happen because we call this with our best seen height, no entries can have higher
    }

    if (blocksAgo >= (int)unconfTxs.size()) {
        if (oldUnconfTxs[bucketindex] > 0) {
            oldUnconfTxs[bucketindex]--;
        } else {
            LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, mempool tx removed from >25 blocks,bucketIndex=%u already\n",
                     bucketindex);
        }
    }
    else {
        unsigned int blockIndex = entryHeight % unconfTxs.size();
        if (unconfTxs[blockIndex][bucketindex] > 0) {
            unconfTxs[blockIndex][bucketindex]--;
        } else {
            LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, mempool tx removed from blockIndex=%u,bucketIndex=%u already\n",
                     blockIndex, bucketindex);
        }
    }
    if (!inBlock && (unsigned int)blocksAgo >= scale) { // Only counts as a failure if not confirmed for entire period
        assert(scale != 0);
        unsigned int periodsAgo = blocksAgo / scale;
        for (size_t i = 0; i < periodsAgo && i < failAvg.size(); i++) {
            failAvg[i][bucketindex]++;
        }
    }
}